

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O0

double Vec_VecMemoryInt(Vec_Vec_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *p_00;
  double dVar2;
  Vec_Vec_t *local_28;
  double Mem;
  int i;
  Vec_Vec_t *p_local;
  
  if (p == (Vec_Vec_t *)0x0) {
    p_local = (Vec_Vec_t *)0x0;
  }
  else {
    local_28 = (Vec_Vec_t *)Vec_PtrMemory((Vec_Ptr_t *)p);
    for (Mem._4_4_ = 0; Mem._4_4_ < p->nSize; Mem._4_4_ = Mem._4_4_ + 1) {
      pVVar1 = Vec_VecEntry(p,Mem._4_4_);
      if (pVVar1 != (Vec_Ptr_t *)0x0) {
        p_00 = Vec_VecEntryInt(p,Mem._4_4_);
        dVar2 = Vec_IntMemory(p_00);
        local_28 = (Vec_Vec_t *)(dVar2 + (double)local_28);
      }
    }
    p_local = local_28;
  }
  return (double)p_local;
}

Assistant:

static inline double Vec_VecMemoryInt( Vec_Vec_t * p )
{
    int i;
    double Mem;
    if ( p == NULL )  return 0.0;
    Mem = Vec_PtrMemory( (Vec_Ptr_t *)p );
    for ( i = 0; i < p->nSize; i++ )
        if ( Vec_VecEntry(p, i) )
            Mem += Vec_IntMemory( Vec_VecEntryInt(p, i) );
    return Mem;
}